

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O0

void __thiscall DDecalFader::Tick(DDecalFader *this)

{
  double dVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  DBaseDecal *pDVar6;
  int fadeDistance;
  int distanceToEnd;
  DDecalFader *this_local;
  
  bVar4 = TObjPtr<DBaseDecal>::operator==(&(this->super_DDecalThinker).TheDecal,(DBaseDecal *)0x0);
  if (bVar4) {
    (*(this->super_DDecalThinker).super_DThinker.super_DObject._vptr_DObject[4])();
  }
  else if ((this->TimeToStartDecay <= ::level.maptime) && ((bglobal._16_1_ & 1) == 0)) {
    if (::level.maptime < this->TimeToEndDecay) {
      if ((this->StartTrans == -1.0) && (!NAN(this->StartTrans))) {
        pDVar6 = TObjPtr<DBaseDecal>::operator->(&(this->super_DDecalThinker).TheDecal);
        this->StartTrans = pDVar6->Alpha;
      }
      iVar5 = this->TimeToEndDecay - ::level.maptime;
      iVar2 = this->TimeToEndDecay;
      iVar3 = this->TimeToStartDecay;
      dVar1 = this->StartTrans;
      pDVar6 = TObjPtr<DBaseDecal>::operator->(&(this->super_DDecalThinker).TheDecal);
      pDVar6->Alpha = (dVar1 * (double)iVar5) / (double)(iVar2 - iVar3);
    }
    else {
      pDVar6 = TObjPtr<DBaseDecal>::operator->(&(this->super_DDecalThinker).TheDecal);
      (*(pDVar6->super_DThinker).super_DObject._vptr_DObject[4])();
      (*(this->super_DDecalThinker).super_DThinker.super_DObject._vptr_DObject[4])();
    }
  }
  return;
}

Assistant:

void DDecalFader::Tick ()
{
	if (TheDecal == NULL)
	{
		Destroy ();
	}
	else
	{
		if (level.maptime < TimeToStartDecay || bglobal.freeze)
		{
			return;
		}
		else if (level.maptime >= TimeToEndDecay)
		{
			TheDecal->Destroy ();		// remove the decal
			Destroy ();					// remove myself
			return;
		}
		if (StartTrans == -1)
		{
			StartTrans = TheDecal->Alpha;
		}

		int distanceToEnd = TimeToEndDecay - level.maptime;
		int fadeDistance = TimeToEndDecay - TimeToStartDecay;
		TheDecal->Alpha = StartTrans * distanceToEnd / fadeDistance;
	}
}